

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>::
enum_parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::optional_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>>
          (enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
          cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>_>
          *m)

{
  res_type this_00;
  const_iterator ppVar1;
  named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *in_RDX;
  basic_cstring<const_char> *in_RSI;
  value_type *in_RDI;
  const_iterator it;
  initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>
  *values;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>_>
  *in_stack_000001b0;
  cstring *in_stack_000001b8;
  parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true>
  *in_stack_000001c0;
  initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>
  *this_01;
  value_type *this_02;
  const_iterator local_50;
  initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>
  local_28;
  named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *local_18;
  
  this_01 = &local_28;
  local_18 = in_RDX;
  unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01,in_RSI);
  parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0,true>::
  parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::optional_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>>
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  in_RDI->m_begin = (iterator)&PTR__enum_parameter_003032f8;
  this_02 = in_RDI + 0x12;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
            *)0x226ae0);
  this_00 = nfp::
            named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
            ::operator[](local_18);
  local_50 = std::
             initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>
             ::begin(this_00);
  while( true ) {
    ppVar1 = std::
             initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>
             ::end(this_01);
    if (local_50 == ppVar1) break;
    std::
    vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
    ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                 *)this_02,in_RDI);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

enum_parameter( cstring name, Modifiers const& m )
#endif
    : base( name, m )
    {
#ifdef BOOST_TEST_CLA_NEW_API
        auto const& values = m[enum_values<EnumType>::value];
        auto it = values.begin();
#else
        std::vector<std::pair<cstring, EnumType> > const& values = m[enum_values<EnumType>::value];
        typename std::vector<std::pair<cstring, EnumType> >::const_iterator it = values.begin();
#endif
        while( it != values.end() ) {
            m_valid_names.push_back( it->first );
            ++it;
        }
    }